

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O1

int array_container_to_uint32_array_vector16
              (void *vout,uint16_t *array,size_t cardinality,uint32_t base)

{
  undefined1 auVar1 [32];
  int iVar2;
  long lVar3;
  uint32_t *out;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [32];
  
  if (cardinality < 8) {
    uVar4 = 0;
    iVar2 = 0;
  }
  else {
    auVar7._4_4_ = base;
    auVar7._0_4_ = base;
    auVar7._8_4_ = base;
    auVar7._12_4_ = base;
    auVar7._16_4_ = base;
    auVar7._20_4_ = base;
    auVar7._24_4_ = base;
    auVar7._28_4_ = base;
    lVar3 = 0;
    uVar5 = 0;
    do {
      auVar1 = vpmovzxwd_avx2(*(undefined1 (*) [16])(array + uVar5));
      auVar1 = vpaddd_avx2(auVar7,auVar1);
      *(undefined1 (*) [32])((long)vout + (lVar3 >> 0x1e)) = auVar1;
      uVar4 = uVar5 + 8;
      uVar6 = uVar5 + 0x10;
      lVar3 = lVar3 + 0x800000000;
      uVar5 = uVar4;
    } while (uVar6 <= cardinality);
    iVar2 = (int)uVar4;
  }
  if (uVar4 < cardinality) {
    lVar3 = 0;
    do {
      *(uint *)((long)vout + lVar3 * 4 + (long)iVar2 * 4) = array[uVar4 + lVar3] + base;
      lVar3 = lVar3 + 1;
    } while (cardinality - uVar4 != lVar3);
    iVar2 = iVar2 + (int)lVar3;
  }
  return iVar2;
}

Assistant:

ALLOW_UNALIGNED
int array_container_to_uint32_array_vector16(void *vout, const uint16_t *array,
                                             size_t cardinality,
                                             uint32_t base) {
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    size_t i = 0;
    for (; i + sizeof(__m128i) / sizeof(uint16_t) <= cardinality;
         i += sizeof(__m128i) / sizeof(uint16_t)) {
        __m128i vinput = _mm_loadu_si128((const __m128i *)(array + i));
        __m256i voutput = _mm256_add_epi32(_mm256_cvtepu16_epi32(vinput),
                                           _mm256_set1_epi32(base));
        _mm256_storeu_si256((__m256i *)(out + outpos), voutput);
        outpos += sizeof(__m256i) / sizeof(uint32_t);
    }
    for (; i < cardinality; ++i) {
        const uint32_t val = base + array[i];
        memcpy(out + outpos, &val,
               sizeof(uint32_t));  // should be compiled as a MOV on x64
        outpos++;
    }
    return outpos;
}